

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O2

void __thiscall TldDSAsKey::Add(TldDSAsKey *this,TldDSAsKey *key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t j;
  ulong uVar9;
  
  uVar1 = key->ds_count;
  uVar3 = key->count;
  uVar2 = this->ds_count;
  uVar4 = this->count;
  this->ds_count = uVar2 + uVar1;
  this->count = uVar4 + uVar3;
  uVar7 = 0;
  do {
    if (key->algo_nb <= uVar7) {
      return;
    }
    uVar5 = this->algo_nb;
    uVar8 = (ulong)uVar5;
    uVar6 = 0;
    do {
      uVar9 = uVar6;
      if (uVar8 == uVar9) {
        if (uVar5 < 8) {
          this->algo_code[uVar8] = key->algo_code[uVar7];
          this->algo_count[uVar8] = key->algo_count[uVar7];
          this->algo_nb = uVar5 + 1;
        }
        goto LAB_0017164c;
      }
      uVar6 = uVar9 + 1;
    } while (this->algo_code[uVar9] != key->algo_code[uVar7]);
    this->algo_count[uVar9] = this->algo_count[uVar9] + key->algo_count[uVar7];
LAB_0017164c:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TldDSAsKey::Add(TldDSAsKey * key)
{
    count += key->count;
    ds_count += key->ds_count;
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool is_found = false;
        for (uint32_t j = 0; j < algo_nb; j++) {
            if (algo_code[j] == key->algo_code[i]) {
                algo_count[j] += key->algo_count[i];
                is_found = true;
                break;
            }
        }
        if (!is_found && algo_nb < 8) {
            algo_code[algo_nb] = key->algo_code[i];
            algo_count[algo_nb] = key->algo_count[i];
            algo_nb++;
        }
    }
}